

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArrayEqualFailureContainsCorrectInfo::
~TestCheckArrayEqualFailureContainsCorrectInfo(TestCheckArrayEqualFailureContainsCorrectInfo *this)

{
  TestCheckArrayEqualFailureContainsCorrectInfo *this_local;
  
  ~TestCheckArrayEqualFailureContainsCorrectInfo(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckArrayEqualFailureContainsCorrectInfo)
{
    int line = 0;
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);

		int const data1[4] = { 0, 1, 2, 3 };
        int const data2[4] = { 0, 1, 3, 3 };
        CHECK_ARRAY_EQUAL (data1, data2, 4);     line = __LINE__;
    }

    CHECK_EQUAL("CheckArrayEqualFailureContainsCorrectInfo", reporter.lastFailedTest);
    CHECK_EQUAL(__FILE__, reporter.lastFailedFile);
    CHECK_EQUAL(line, reporter.lastFailedLine);
}